

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IdlFbInterfaces.h
# Opt level: O0

IStatus * Firebird::
          IStatusBaseImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::IDisposableImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IVersionedImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>_>_>_>
          ::cloopcloneDispatcher(IStatus *self)

{
  int iVar1;
  undefined4 extraout_var;
  int in_ECX;
  void *in_RDX;
  __fn *in_RSI;
  void *in_R8;
  BaseStatusWrapper<Firebird::ThrowStatusWrapper> *local_38;
  IStatus *self_local;
  
  if (self == (IStatus *)0x0) {
    local_38 = (BaseStatusWrapper<Firebird::ThrowStatusWrapper> *)0x0;
  }
  else {
    local_38 = (BaseStatusWrapper<Firebird::ThrowStatusWrapper> *)
               &self[-1].super_IDisposable.super_IVersioned.cloopVTable;
  }
  iVar1 = BaseStatusWrapper<Firebird::ThrowStatusWrapper>::clone
                    (local_38,in_RSI,in_RDX,in_ECX,in_R8);
  return (IStatus *)CONCAT44(extraout_var,iVar1);
}

Assistant:

static IStatus* CLOOP_CARG cloopcloneDispatcher(const IStatus* self) throw()
		{
			try
			{
				return static_cast<const Name*>(self)->Name::clone();
			}
			catch (...)
			{
				StatusType::catchException(0);
				return static_cast<IStatus*>(0);
			}
		}